

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

IRIns * aa_findcnew(jit_State *J,IRIns *ir)

{
  IRIns *pIVar1;
  
  while( true ) {
    if ((ir->field_1).o != ')') {
      pIVar1 = (IRIns *)0x0;
      if ((ir->field_1).o == 'S') {
        pIVar1 = ir;
      }
      return pIVar1;
    }
    if (((short)(ir->field_0).op1 < 0) &&
       (pIVar1 = aa_findcnew(J,(J->cur).ir + (ir->field_0).op1), pIVar1 != (IRIns *)0x0)) break;
    if (-1 < (short)(ir->field_0).op2) {
      return (IRIns *)0x0;
    }
    ir = (J->cur).ir + (ir->field_0).op2;
  }
  return pIVar1;
}

Assistant:

static IRIns *aa_findcnew(jit_State *J, IRIns *ir)
{
  while (ir->o == IR_ADD) {
    if (!irref_isk(ir->op1)) {
      IRIns *ir1 = aa_findcnew(J, IR(ir->op1));  /* Left-recursion. */
      if (ir1) return ir1;
    }
    if (irref_isk(ir->op2)) return NULL;
    ir = IR(ir->op2);  /* Flatten right-recursion. */
  }
  return ir->o == IR_CNEW ? ir : NULL;
}